

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

bool __thiscall HEkk::bailout(HEkk *this)

{
  double *pdVar1;
  bool bVar2;
  size_t in_RCX;
  void *in_RDX;
  HighsCallback *in_RDI;
  double extraout_XMM0_Qa;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_stack_ffffffffffffff90;
  bool local_59;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  reference in_stack_ffffffffffffffe8;
  HighsCallback *this_00;
  
  if ((in_RDI[0x37].user_callback.super__Function_base._M_functor._M_pod_data[8] & 1U) == 0) {
    pdVar1 = (double *)
             (*(long *)((long)&(in_RDI->user_callback).super__Function_base._M_functor + 8) + 0x88);
    this_00 = in_RDI;
    if ((INFINITY < *pdVar1 || *pdVar1 == INFINITY) ||
       (HighsTimer::read((HighsTimer *)(in_RDI->user_callback).super__Function_base._M_manager,0,
                         in_RDX,in_RCX),
       pdVar1 = (double *)
                (*(long *)((long)&(in_RDI->user_callback).super__Function_base._M_functor + 8) +
                0x88), extraout_XMM0_Qa < *pdVar1 || extraout_XMM0_Qa == *pdVar1)) {
      if (*(int *)&in_RDI[0x36].data_in.user_solution <
          *(int *)(*(long *)((long)&(in_RDI->user_callback).super__Function_base._M_functor + 8) +
                  0x178)) {
        bVar2 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff90);
        local_59 = false;
        if (bVar2) {
          in_stack_ffffffffffffffe8 =
               std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_ffffffffffffffb0,(size_type)in_RDI);
          local_59 = std::_Bit_reference::operator_cast_to_bool
                               ((_Bit_reference *)&stack0xffffffffffffffe8);
        }
        if (local_59 != false) {
          HighsCallback::clearHighsCallbackDataOut
                    (*(HighsCallback **)&(in_RDI->user_callback).super__Function_base._M_functor);
          *(undefined4 *)(*(long *)&(in_RDI->user_callback).super__Function_base._M_functor + 0x68)
               = *(undefined4 *)&in_RDI[0x36].data_in.user_solution;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_38,"Simplex interrupt",&local_39);
          bVar2 = HighsCallback::callbackAction
                            (this_00,in_stack_ffffffffffffffe8._M_mask._4_4_,
                             (string *)in_stack_ffffffffffffffe8._M_p);
          std::__cxx11::string::~string(local_38);
          std::allocator<char>::~allocator((allocator<char> *)&local_39);
          if (bVar2) {
            highsLogDev((HighsLogOptions *)
                        (*(long *)((long)&(in_RDI->user_callback).super__Function_base._M_functor +
                                  8) + 0x380),kInfo,"User interrupt\n");
            in_RDI[0x37].user_callback.super__Function_base._M_functor._M_pod_data[8] = '\x01';
            in_RDI[0x29].data_out.pdlp_iteration_count = 0x11;
          }
        }
      }
      else {
        in_RDI[0x37].user_callback.super__Function_base._M_functor._M_pod_data[8] = '\x01';
        in_RDI[0x29].data_out.pdlp_iteration_count = 0xe;
      }
    }
    else {
      in_RDI[0x37].user_callback.super__Function_base._M_functor._M_pod_data[8] = '\x01';
      in_RDI[0x29].data_out.pdlp_iteration_count = 0xd;
    }
  }
  return (bool)(in_RDI[0x37].user_callback.super__Function_base._M_functor._M_pod_data[8] & 1);
}

Assistant:

bool HEkk::bailout() {
  if (solve_bailout_) {
    // Bailout has already been decided: check that it's for one of these
    // reasons
    assert(model_status_ == HighsModelStatus::kTimeLimit ||
           model_status_ == HighsModelStatus::kIterationLimit ||
           model_status_ == HighsModelStatus::kObjectiveBound ||
           model_status_ == HighsModelStatus::kObjectiveTarget);
  } else if (options_->time_limit < kHighsInf &&
             timer_->read() > options_->time_limit) {
    solve_bailout_ = true;
    model_status_ = HighsModelStatus::kTimeLimit;
  } else if (iteration_count_ >= options_->simplex_iteration_limit) {
    solve_bailout_ = true;
    model_status_ = HighsModelStatus::kIterationLimit;
  } else if (callback_->user_callback &&
             callback_->active[kCallbackSimplexInterrupt]) {
    callback_->clearHighsCallbackDataOut();
    callback_->data_out.simplex_iteration_count = iteration_count_;
    if (callback_->callbackAction(kCallbackSimplexInterrupt,
                                  "Simplex interrupt")) {
      highsLogDev(options_->log_options, HighsLogType::kInfo,
                  "User interrupt\n");
      solve_bailout_ = true;
      model_status_ = HighsModelStatus::kInterrupt;
    }
  }
  return solve_bailout_;
}